

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall GdlGlyphIntersectionClassDefn::ComputeMembers(GdlGlyphIntersectionClassDefn *this)

{
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __first;
  bool bVar1;
  ulong uVar2;
  reference ppGVar3;
  size_type_conflict sVar4;
  reference pvVar5;
  GdlGlyphClassDefn *this_00;
  GdlGlyphClassMember *pGVar6;
  GdlGlyphDefn *pGVar7;
  long in_RDI;
  GdlGlyphDefn *pglfd;
  size_t igid;
  GrpLineAndFile lnf;
  size_t igid2;
  bool fFound;
  size_t igid1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vgid2;
  size_t iglfc;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vgid1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vgidResult;
  int nFirst;
  GdlGlyphDefn *in_stack_fffffffffffffed8;
  value_type_conflict2 *in_stack_fffffffffffffee8;
  GdlGlyphClassMember *pglfd_00;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffef0;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  GdlGlyphClassMember *local_c0;
  ulong local_80;
  ulong local_70;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_68;
  ulong local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_38;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_20;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x13c839);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x13c84b);
  ppGVar3 = std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::operator[]
                      ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)
                       (in_RDI + 0x110),0);
  (*((*ppGVar3)->super_GdlDefn)._vptr_GdlDefn[0x12])(*ppGVar3,&local_38);
  local_50 = 1;
  do {
    uVar2 = local_50;
    sVar4 = std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::size
                      ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)
                       (in_RDI + 0x110));
    if (sVar4 <= uVar2) {
      this_00 = (GdlGlyphClassDefn *)GdlObject::LineAndFile((GdlObject *)(in_RDI + 8));
      GrpLineAndFile::GrpLineAndFile
                ((GrpLineAndFile *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (GrpLineAndFile *)in_stack_fffffffffffffef8._M_current);
      local_c0 = (GdlGlyphClassMember *)0x0;
      while( true ) {
        pglfd_00 = local_c0;
        pGVar6 = (GdlGlyphClassMember *)
                 std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_20);
        if (pGVar6 <= pglfd_00) break;
        pGVar7 = (GdlGlyphDefn *)operator_new(0xb0);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  (&local_20,(size_type_conflict)local_c0);
        uVar2 = (ulong)in_stack_fffffffffffffed8 >> 0x20;
        nFirst = (int)in_stack_fffffffffffffed8;
        in_stack_fffffffffffffed8 = pGVar7;
        GdlGlyphDefn::GdlGlyphDefn(pGVar7,(GlyphType)uVar2,nFirst);
        pGVar7 = in_stack_fffffffffffffed8;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  (&local_20,(size_type_conflict)local_c0);
        GdlGlyphDefn::AddGlyphID(pGVar7,(utf16)((ulong)in_stack_fffffffffffffed8 >> 0x30));
        GdlGlyphClassDefn::AddMember(this_00,pglfd_00,(GrpLineAndFile *)pGVar7);
        local_c0 = (GdlGlyphClassMember *)((long)&(local_c0->super_GdlDefn)._vptr_GdlDefn + 1);
      }
      GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x13cc08);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00);
      return;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x13c8be);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x13c8d0);
    ppGVar3 = std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::operator[]
                        ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)
                         (in_RDI + 0x110),local_50);
    (*((*ppGVar3)->super_GdlDefn)._vptr_GdlDefn[0x12])(*ppGVar3,&local_68);
    local_70 = 0;
    while( true ) {
      sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_38);
      if (sVar4 <= local_70) break;
      bVar1 = false;
      local_80 = 0;
      while( true ) {
        sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_68);
        if (sVar4 <= local_80) break;
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (&local_68,local_80);
        in_stack_ffffffffffffff04 = (uint)*pvVar5;
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (&local_38,local_70);
        if (in_stack_ffffffffffffff04 == *pvVar5) {
          bVar1 = true;
          break;
        }
        local_80 = local_80 + 1;
      }
      if (bVar1) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](&local_38,local_70)
        ;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
      local_70 = local_70 + 1;
    }
    in_stack_fffffffffffffef8._M_current = (unsigned_short *)&local_20;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffed8)
    ;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffed8)
    ;
    __first._M_current._4_4_ = in_stack_ffffffffffffff04;
    __first._M_current._0_4_ = in_stack_ffffffffffffff00;
    std::vector<unsigned_short,std::allocator<unsigned_short>>::
    assign<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,void>
              (in_stack_fffffffffffffef0,__first,in_stack_fffffffffffffef8);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(in_stack_fffffffffffffef0)
    ;
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

void GdlGlyphIntersectionClassDefn::ComputeMembers()
{
	std::vector<utf16> vgidResult;

	std::vector<utf16> vgid1;
	m_vpglfdSets[0]->FlattenGlyphList(vgid1);

	for (size_t iglfc = 1; iglfc < this->m_vpglfdSets.size(); iglfc++)
	{
		vgidResult.clear();
		std::vector<utf16> vgid2;
		m_vpglfdSets[iglfc]->FlattenGlyphList(vgid2);
		for (size_t igid1 = 0; igid1 < vgid1.size(); igid1++)
		{
			bool fFound = false;
			for (size_t igid2 = 0; igid2 < vgid2.size(); igid2++)
			{
				if (vgid2[igid2] == vgid1[igid1])
				{
					fFound = true;
					break;
				}
			}
			if (fFound)
				vgidResult.push_back(vgid1[igid1]);

		}
		vgid1.assign(vgidResult.begin(), vgidResult.end());
	}

	// Fake a simple class definition that contains these glyphs.
	GrpLineAndFile lnf = this->LineAndFile();
	for (size_t igid = 0; igid < vgidResult.size(); igid++)
	{
		GdlGlyphDefn * pglfd = new GdlGlyphDefn(kglftGlyphID, vgidResult[igid]);
		pglfd->AddGlyphID(vgidResult[igid]);
		this->AddMember(pglfd, lnf);
	}
}